

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorldImporter.cpp
# Opt level: O2

btCollisionShape * __thiscall
btCollisionWorldImporter::createCapsuleShapeY
          (btCollisionWorldImporter *this,btScalar radius,btScalar height)

{
  btCollisionShape *this_00;
  btCollisionShape *local_18;
  
  this_00 = (btCollisionShape *)btCapsuleShape::operator_new(0x48);
  btCapsuleShape::btCapsuleShape((btCapsuleShape *)this_00,radius,height);
  local_18 = this_00;
  btAlignedObjectArray<btCollisionShape_*>::push_back(&this->m_allocatedCollisionShapes,&local_18);
  return this_00;
}

Assistant:

btCollisionShape* btCollisionWorldImporter::createCapsuleShapeY(btScalar radius, btScalar height)
{
	btCapsuleShape* shape = new btCapsuleShape(radius,height);
	m_allocatedCollisionShapes.push_back(shape);
	return shape;
}